

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_math_test.h
# Opt level: O2

void test_base<int,int,bool(*)(int,int,int*),int(*)(int,int),0>
               (char *type_str,_func_bool_int_int_int_ptr *fcn1,_func_int_int_int *fcn2)

{
  bool bVar1;
  runtime_error *prVar2;
  bool bVar3;
  TestCase<int,_int,_0> TVar4;
  allocator local_d5;
  int ret;
  char *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string msg;
  TestVector<int,_int,_0> tests;
  
  tests.test_cases = (TestCase<int,_int,_0> *)0x0;
  tests.count = 0;
  tests.current = 0;
  local_d0 = type_str;
  TVar4 = TestVector<int,_int,_0>::GetNext(&tests);
  while( true ) {
    if (tests.count <= tests.current) {
      return;
    }
    bVar1 = (*fcn1)(TVar4.x,TVar4.y,&ret);
    bVar3 = (bool)(TVar4.fExpected & 1);
    if (bVar1 != bVar3) break;
    ret = (*fcn2)(TVar4.x,TVar4.y);
    if (bVar3 != true) {
      std::__cxx11::string::string((string *)&local_c8,"Failure in ",&local_d5);
      std::operator+(&local_a8,&local_c8,"Mult");
      std::operator+(&local_88,&local_a8,"_test_");
      std::operator+(&msg,&local_88,local_d0);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,msg._M_dataplus._M_p);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    TVar4 = TestVector<int,_int,_0>::GetNext(&tests);
  }
  std::__cxx11::string::string((string *)&local_c8,"Failure in ",&local_d5);
  std::operator+(&local_a8,&local_c8,"Mult");
  std::operator+(&local_88,&local_a8,"_test_");
  std::operator+(&msg,&local_88,local_d0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,msg._M_dataplus._M_p);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_base(const char* type_str, F1 fcn1, F2 fcn2)
{
	TestVector< T, U, op > tests;
	TestCase<T, U, op > test = tests.GetNext();

	while (!tests.Done())
	{
		T ret;

		// err_msg(std::string(OpName::op_name(op)) + "_test_" + type_str + " enter: ", test.x, test.y, test.fExpected);

		check_test<T, U> ct;
		bool result = ct.operator()(fcn1, test.x, test.y, &ret);

		if (!!result != test.fExpected)
		{
			std::string msg = std::string("Failure in ") + OpName::op_name(op) + "_test_" + type_str;
			// err_msg(msg, test.x, test.y, test.fExpected);
			throw std::runtime_error(msg.c_str());
		}

		bool actual;
		try
		{
			safe_test<T, U> st;
			ret = st.operator()(fcn2, test.x, test.y);
			actual = true;
		}
		catch (...)
		{
			actual = false;
		}

		if (actual != test.fExpected)
		{
			std::string msg = std::string("Failure in ") + OpName::op_name(op) + "_test_" + type_str;
			// err_msg(msg, test.x, test.y, test.fExpected);
			throw std::runtime_error(msg.c_str());
		}

		// err_msg(std::string(OpName::op_name(op)) + "_test_" + type_str + " completed: ", test.x, test.y, test.fExpected);
		test = tests.GetNext();
	}
}